

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadU8(BinaryReader *this,uint8_t *out_value,char *desc)

{
  Offset *pOVar1;
  Offset OVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  OVar2 = (this->state_).offset;
  if (this->read_end_ < OVar2 + 1) {
    PrintError(this,"unable to read %s: %s","uint8_t",desc,in_R8,in_R9,OVar2);
    return (Result)Error;
  }
  *out_value = (this->state_).data[OVar2];
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadU8(uint8_t* out_value, const char* desc) {
  return ReadT(out_value, "uint8_t", desc);
}